

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildNameCommand.h
# Opt level: O0

void __thiscall cmBuildNameCommand::~cmBuildNameCommand(cmBuildNameCommand *this)

{
  cmBuildNameCommand *this_local;
  
  cmCommand::~cmCommand(&this->super_cmCommand);
  return;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmBuildNameCommand; }